

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

VariableDeclaration * __thiscall
soul::PoolAllocator::
allocate<soul::AST::VariableDeclaration,soul::AST::Context&,soul::AST::Expression&,soul::pool_ptr<soul::AST::Expression>&,bool&>
          (PoolAllocator *this,Context *args,Expression *args_1,
          pool_ptr<soul::AST::Expression> *args_2,bool *args_3)

{
  Expression *c;
  Context *this_00;
  DestructorFn *pDVar1;
  _lambda_void___1_ local_5d [13];
  pool_ptr<soul::AST::Expression> local_50;
  pool_ptr<soul::AST::Expression> local_48;
  VariableDeclaration *local_40;
  VariableDeclaration *newObject;
  PoolItem *newItem;
  bool *args_local_3;
  pool_ptr<soul::AST::Expression> *args_local_2;
  Expression *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_3;
  args_local_3 = (bool *)args_2;
  args_local_2 = (pool_ptr<soul::AST::Expression> *)args_1;
  args_local_1 = (Expression *)args;
  args_local = (Context *)this;
  newObject = (VariableDeclaration *)allocateSpaceForObject(this,0x78);
  c = args_local_1;
  this_00 = &(newObject->super_Statement).super_ASTObject.context;
  pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
            (&local_48,(Expression *)args_local_2);
  local_50.object = *(Expression **)args_local_3;
  AST::VariableDeclaration::VariableDeclaration
            ((VariableDeclaration *)this_00,(Context *)c,&local_48,&local_50,
             (bool)((byte)newItem->size & 1));
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_50);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_48);
  local_40 = (VariableDeclaration *)this_00;
  pDVar1 = allocate(soul::AST::Context&,soul::AST::Expression&,soul::pool_ptr&,bool&)::
           {lambda(void*)#1}::operator_cast_to_function_pointer(local_5d);
  *(DestructorFn **)&(newObject->super_Statement).super_ASTObject.objectType = pDVar1;
  return local_40;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }